

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>::
findBucketWithHash<QTextureGlyphCache::GlyphAndSubPixelPosition>
          (Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
           *this,GlyphAndSubPixelPosition *key,size_t hash)

{
  Entry *pEVar1;
  undefined8 uVar2;
  Span *pSVar3;
  bool bVar4;
  Span *pSVar5;
  Span *pSVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  Bucket BVar11;
  
  pSVar3 = this->spans;
  uVar7 = this->numBuckets - 1 & hash;
  pSVar5 = pSVar3 + (uVar7 >> 7);
  uVar7 = (ulong)((uint)uVar7 & 0x7f);
  do {
    uVar8 = (ulong)pSVar5->offsets[uVar7];
    if ((uVar8 == 0xff) ||
       ((*(glyph_t *)pSVar5->entries[uVar8].storage.data == key->glyph &&
        (pEVar1 = pSVar5->entries + uVar8, uVar2 = *(undefined8 *)((pEVar1->storage).data + 4),
        auVar9._0_4_ = -(uint)((int)uVar2 == (key->subPixelPosition).x.val),
        iVar10 = -(uint)((int)((ulong)uVar2 >> 0x20) == (key->subPixelPosition).y.val),
        auVar9._4_4_ = auVar9._0_4_, auVar9._8_4_ = iVar10, auVar9._12_4_ = iVar10,
        iVar10 = movmskpd((int)pEVar1,auVar9), iVar10 == 3)))) {
      bVar4 = false;
    }
    else {
      uVar7 = uVar7 + 1;
      bVar4 = true;
      if (uVar7 == 0x80) {
        pSVar6 = pSVar5 + 1;
        pSVar5 = pSVar3;
        if (((long)pSVar6 - (long)pSVar3 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) != 0)
        {
          pSVar5 = pSVar6;
        }
        uVar7 = 0;
      }
    }
  } while (bVar4);
  BVar11.index = uVar7;
  BVar11.span = pSVar5;
  return BVar11;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }